

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsImport.cpp
# Opt level: O1

int rotate_point(double cx,double cy,double angle,POINT *subject)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = subject->x;
  dVar3 = subject->y;
  dVar1 = (angle * 3.141592653589) / 180.0;
  dVar2 = sin(dVar1);
  dVar1 = cos(dVar1);
  dVar5 = dVar5 - cx;
  dVar3 = dVar3 - cy;
  dVar4 = round((dVar5 * dVar1 - dVar2 * dVar3) + cx);
  dVar5 = round(dVar1 * dVar3 + dVar5 * dVar2 + cy);
  subject->x = dVar4;
  subject->y = dVar5;
  return 0;
}

Assistant:

int rotate_point(double cx, double cy, double angle, POINT &subject)
{
  POINT p = subject;
  angle = angle * 3.141592653589 / 180; // convert angle to radians
  double s = sin(angle);
  double c = cos(angle);

  // translate point back to origin:
  p.x -= cx;
  p.y -= cy;

  // rotate point
  double xnew = p.x * c - p.y * s;
  double ynew = p.x * s + p.y * c;

  // translate point back:
  p.x = round(xnew + cx);
  p.y = round(ynew + cy);
  subject = p;         // Overwrite the original point with the rotated one.
  return EXIT_SUCCESS; // Indicate successful conversion.
}